

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::http_stream::
connected<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (http_stream *this,error_code *e,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  bool bVar1;
  ulong uVar2;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *u;
  endpoint *ep;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_1d8;
  http_stream *local_1b8;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__http_stream_hpp:116:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_1b0;
  mutable_buffer local_188;
  allocator<char> local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string endpoint;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> p;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *h_local;
  error_code *e_local;
  http_stream *this_local;
  
  bVar1 = proxy_base::
          handle_error<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>&>
                    (&this->super_proxy_base,e,h);
  if (!bVar1) {
    if ((this->m_no_connect & 1U) == 0) {
      ::std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>::back_insert_iterator
                ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8),&this->m_buffer);
      print_endpoint_abi_cxx11_
                ((string *)local_60,(aux *)&(this->super_proxy_base).m_remote_endpoint,ep);
      ::std::operator+(&local_a0,"CONNECT ",(string *)local_60);
      ::std::operator+(&local_80,&local_a0," HTTP/1.0\r\n");
      write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (&local_80,
                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8));
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        ::std::operator+(&local_150,&this->m_user,":");
        ::std::operator+(&local_130,&local_150,&this->m_password);
        base64encode(&local_110,&local_130);
        ::std::operator+(&local_f0,"Proxy-Authorization: Basic ",&local_110);
        ::std::operator+(&local_d0,&local_f0,"\r\n");
        write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                  (&local_d0,
                   (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                   ((long)&endpoint.field_2 + 8));
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::__cxx11::string::~string((string *)&local_110);
        ::std::__cxx11::string::~string((string *)&local_130);
        ::std::__cxx11::string::~string((string *)&local_150);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"\r\n",&local_171);
      write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                (&local_170,
                 (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&endpoint.field_2 + 8));
      ::std::__cxx11::string::~string((string *)&local_170);
      ::std::allocator<char>::~allocator(&local_171);
      local_188 = boost::asio::buffer<char,std::allocator<char>>(&this->m_buffer);
      u = (_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
           *)local_188.data_;
      local_1b8 = this;
      ::std::
      _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::_Bind(&local_1d8,h);
      wrap_allocator<libtorrent::aux::http_stream::connected<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&local_1b0,(aux *)local_1b8,(http_stream *)&local_1d8,u);
      boost::asio::
      async_write<libtorrent::aux::noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,boost::asio::mutable_buffer,libtorrent::aux::wrap_allocator_t<libtorrent::aux::http_stream::connected<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,unsigned_long,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                ((noexcept_movable<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>
                  *)this,&local_188,&local_1b0,(type *)0x0);
      wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/http_stream.hpp:116:4),_std::_Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
      ::~wrap_allocator_t(&local_1b0);
      ::std::
      _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::~_Bind(&local_1d8);
      ::std::__cxx11::string::~string((string *)local_60);
    }
    else {
      memset(&p,0,0x18);
      ::std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&p);
      ::std::vector<char,_std::allocator<char>_>::swap
                ((vector<char,_std::allocator<char>_> *)&p,&this->m_buffer);
      ::std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&p)
      ;
      ::std::
      _Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
      ::operator()((_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>
                    *)h,e);
    }
  }
  return;
}

Assistant:

void connected(error_code const& e, Handler h)
	{
		if (handle_error(e, h)) return;

		using namespace libtorrent::aux;

		if (m_no_connect)
		{
			std::vector<char>().swap(m_buffer);
			std::move(h)(e);
			return;
		}

		// send CONNECT
		std::back_insert_iterator<std::vector<char>> p(m_buffer);
		std::string const endpoint = print_endpoint(m_remote_endpoint);
		write_string("CONNECT " + endpoint + " HTTP/1.0\r\n", p);
		if (!m_user.empty())
		{
			write_string("Proxy-Authorization: Basic " + base64encode(
				m_user + ":" + m_password) + "\r\n", p);
		}
		write_string("\r\n", p);
		async_write(m_sock, boost::asio::buffer(m_buffer), wrap_allocator(
			[this](error_code const& ec, std::size_t, Handler hn) {
				handshake1(ec, std::move(hn));
			}, std::move(h)));
	}